

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GyroscopeSensor.cpp
# Opt level: O1

string * __thiscall
iDynTree::GyroscopeSensor::getName_abi_cxx11_(string *__return_storage_ptr__,GyroscopeSensor *this)

{
  GyroscopePrivateAttributes *pGVar1;
  pointer pcVar2;
  
  pGVar1 = this->pimpl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pGVar1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pGVar1->name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string GyroscopeSensor::getName() const
{
    return this->pimpl->name;
}